

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall TArray<VMValue,_VMValue>::Push(TArray<VMValue,_VMValue> *this,VMValue *item)

{
  uint uVar1;
  
  Grow(this,1);
  VMValue::VMValue(this->Array + this->Count,item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}